

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TypeAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TypeAssignmentSyntax,slang::parsing::Token,slang::syntax::EqualsTypeClauseSyntax*>
          (BumpAllocator *this,Token *args,EqualsTypeClauseSyntax **args_1)

{
  EqualsTypeClauseSyntax *pEVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TypeAssignmentSyntax *pTVar7;
  
  pTVar7 = (TypeAssignmentSyntax *)allocate(this,0x30,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pEVar1 = *args_1;
  (pTVar7->super_SyntaxNode).kind = TypeAssignment;
  (pTVar7->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pTVar7->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pTVar7->name).kind = TVar3;
  (pTVar7->name).field_0x2 = uVar4;
  (pTVar7->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pTVar7->name).rawLen = uVar6;
  (pTVar7->name).info = pIVar2;
  pTVar7->assignment = pEVar1;
  if (pEVar1 != (EqualsTypeClauseSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)pTVar7;
  }
  return pTVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }